

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O0

void drawImage1(Array2D<Imf_3_2::Rgba> *px,int w,int h)

{
  Rgba *pRVar1;
  int in_EDX;
  int in_ESI;
  Array2D<Imf_3_2::Rgba> *in_RDI;
  float yc;
  float rc;
  float rd;
  float gn;
  float bl;
  float lm;
  double dVar2;
  double dVar3;
  double dVar4;
  float yr;
  float xr;
  float yq;
  float xq;
  float r;
  float yp;
  float xp;
  float t;
  int i;
  int n;
  Rgba *p;
  int x;
  int y;
  float in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  float xc;
  int h_00;
  int w_00;
  Array2D<Imf_3_2::Rgba> *in_stack_ffffffffffffffe0;
  int local_18;
  int local_14;
  
  for (local_14 = 0; local_14 < in_EDX; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
      pRVar1 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](in_RDI,(long)local_14);
      in_stack_ffffffffffffffe0 = (Array2D<Imf_3_2::Rgba> *)(pRVar1 + local_18);
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c);
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c);
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c);
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c);
    }
  }
  w_00 = 0x15e0;
  for (h_00 = 0; h_00 < w_00; h_00 = h_00 + 1) {
    xc = ((float)h_00 * 2.0 * 3.1415927) / (float)w_00;
    dVar2 = sin((double)xc * 2.0);
    dVar3 = sin((double)xc * 15.0);
    yc = (float)(dVar3 * 0.2 + dVar2);
    dVar2 = cos((double)xc * 3.0);
    dVar3 = cos((double)xc * 15.0);
    rc = (float)(dVar3 * 0.2 + dVar2);
    rd = (float)(h_00 + 1) / (float)w_00;
    dVar2 = (double)yc;
    dVar4 = (double)rd;
    dVar3 = sin((double)xc * 80.0);
    gn = (float)(dVar4 * 0.3 * dVar3 + dVar2);
    dVar2 = (double)rc;
    dVar4 = (double)rd;
    dVar3 = cos((double)xc * 80.0);
    bl = (float)(dVar4 * 0.3 * dVar3 + dVar2);
    dVar2 = (double)yc;
    dVar4 = (double)rd;
    dVar3 = sin((double)xc * 80.0 + 1.5707963267948966);
    lm = (float)(dVar4 * 0.3 * dVar3 + dVar2);
    cos((double)xc * 80.0 + 1.5707963267948966);
    if (h_00 % 10 == 0) {
      anon_unknown.dwarf_113f::sp(in_stack_ffffffffffffffe0,w_00,h_00,xc,yc,rc,rd,gn,bl,lm);
    }
    anon_unknown.dwarf_113f::sp(in_stack_ffffffffffffffe0,w_00,h_00,xc,yc,rc,rd,gn,bl,lm);
    anon_unknown.dwarf_113f::sp(in_stack_ffffffffffffffe0,w_00,h_00,xc,yc,rc,rd,gn,bl,lm);
  }
  return;
}

Assistant:

void
drawImage1 (Array2D<Rgba>& px, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = px[y][x];
            p.r     = 0;
            p.g     = 0;
            p.b     = 0;
            p.a     = 0;
        }
    }

    int n = 5600;

    for (int i = 0; i < n; ++i)
    {
        float t  = (i * 2.0 * M_PI) / n;
        float xp = sin (t * 2.0) + 0.2 * sin (t * 15.0);
        float yp = cos (t * 3.0) + 0.2 * cos (t * 15.0);
        float r  = float (i + 1) / float (n);
        float xq = xp + 0.3 * r * sin (t * 80.0);
        float yq = yp + 0.3 * r * cos (t * 80.0);
        float xr = xp + 0.3 * r * sin (t * 80.0 + M_PI / 2);
        float yr = yp + 0.3 * r * cos (t * 80.0 + M_PI / 2);

        if (i % 10 == 0)
            sp (px,
                w,
                h,
                xp * w / 3 + w / 2,
                yp * h / 3 + h / 2,
                w * 0.05 * r,
                2.0,
                0.8,
                0.1,
                0.5 * r * r);

        sp (px,
            w,
            h,
            xq * w / 3 + w / 2,
            yq * h / 3 + h / 2,
            w * 0.01 * r,
            0.7,
            0.2,
            2.0,
            0.5 * r * r);

        sp (px,
            w,
            h,
            xr * w / 3 + w / 2,
            yr * h / 3 + h / 2,
            w * 0.01 * r,
            0.2,
            1.5,
            0.1,
            0.5 * r * r);
    }
}